

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DNATypes.cpp
# Opt level: O3

bool DNA::contains(Base *dna1,size_t size1,Base *dna2,size_t size2)

{
  Base *pBVar1;
  Base *matcher;
  long lVar2;
  ulong uVar3;
  bool bVar4;
  
  if (size1 < size2) {
    return false;
  }
  pBVar1 = dna2;
  if (size1 != 0) {
    lVar2 = 0;
    uVar3 = 0;
    do {
      if (uVar3 == 0) {
        uVar3 = (ulong)(*pBVar1 == *(Base *)((long)dna1 + lVar2));
        pBVar1 = pBVar1 + uVar3;
      }
      else {
        if (pBVar1 == dna2 + size2) {
          return true;
        }
        bVar4 = *pBVar1 == *(Base *)((long)dna1 + lVar2);
        uVar3 = (ulong)bVar4;
        pBVar1 = pBVar1 + 1;
        if (!bVar4) {
          pBVar1 = dna2;
        }
      }
      lVar2 = lVar2 + 4;
    } while (size1 * 4 != lVar2);
  }
  return pBVar1 == dna2 + size2;
}

Assistant:

bool DNA::contains(const DNA::Base* dna1, 
                   size_t size1, 
                   const DNA::Base* dna2, 
                   size_t size2)
{
    bool mode = false;
    const DNA::Base* end1 = dna1 + size1;
    const DNA::Base* end2 = dna2 + size2;
    const DNA::Base* matcher = dna2;
    if (size2 > size1)
        return false;
    while (dna1 != end1) {
        if (mode) {
            if (matcher == end2)
                return true;
            else if (*matcher == *dna1)
                ++matcher;
            else {
                matcher = dna2;
                mode = false;
            }
        } else {
            if (*matcher == *dna1) {
                mode = true;
                ++matcher;
            }
        }
        ++dna1;
    }
    // Check once here incase it's at the end
    if (matcher == end2)
        return true;
    return false;
}